

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void commit(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info,ecs_table_t *dst_table,
           ecs_entities_t *added,ecs_entities_t *removed)

{
  int iVar1;
  ecs_table_t *table;
  ecs_record_t *record;
  ulong uVar2;
  _Bool _Var3;
  int32_t iVar4;
  int32_t iVar5;
  uint new_index;
  ecs_data_t *data;
  ecs_record_t *peVar6;
  uint uVar7;
  ecs_data_t *peVar8;
  undefined8 local_40;
  int local_38;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x480);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x480,
                  "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  table = info->table;
  if (table == dst_table) {
    if ((added == (ecs_entities_t *)0x0) || (added->count == 0)) {
      if (removed == (ecs_entities_t *)0x0) {
        return;
      }
      iVar1 = removed->count;
      if (dst_table == (ecs_table_t *)0x0 || iVar1 == 0) {
        return;
      }
      if ((table->flags & 0x10000) == 0) {
        return;
      }
      peVar8 = info->data;
      iVar5 = info->row;
      if (added == (ecs_entities_t *)0x0) goto LAB_00113607;
      set_switch(world,table,peVar8,iVar5,1,(ecs_entities_t *)added->array,SUB41(added->count,0));
    }
    else {
      if (dst_table == (ecs_table_t *)0x0) {
        return;
      }
      if ((table->flags & 0x10000) == 0) {
        return;
      }
      peVar8 = info->data;
      iVar5 = info->row;
      set_switch(world,table,peVar8,iVar5,1,(ecs_entities_t *)added->array,SUB41(added->count,0));
      if (removed == (ecs_entities_t *)0x0) {
        return;
      }
    }
    iVar1 = removed->count;
LAB_00113607:
    set_switch(world,table,peVar8,iVar5,1,(ecs_entities_t *)removed->array,SUB41(iVar1,0));
    return;
  }
  if (table == (ecs_table_t *)0x0) {
    if (dst_table->type == (ecs_type_t)0x0) goto LAB_00113871;
    iVar5 = new_entity(world,entity,info,dst_table,added);
    info->row = iVar5;
  }
  else {
    peVar8 = info->data;
    _ecs_assert(dst_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x493);
    if (dst_table == (ecs_table_t *)0x0) {
      __assert_fail("dst_table != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x493,
                    "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    iVar5 = info->row;
    if (dst_table->type == (ecs_type_t)0x0) {
      delete_entity(world,table,peVar8,iVar5,removed);
      local_40 = 0;
      local_38 = -(uint)info->is_watched;
      _ecs_sparse_set((world->store).entity_index,0x10,entity,&local_40);
      goto LAB_00113871;
    }
    data = ecs_table_get_or_create_data(dst_table);
    _ecs_assert(data != peVar8,0xc,(char *)0x0,"src_data != dst_data",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3d9);
    if (data == peVar8) {
      __assert_fail("src_data != dst_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3d9,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    _Var3 = ecs_sparse_is_alive((world->store).entity_index,entity);
    _ecs_assert(_Var3,2,(char *)0x0,"ecs_is_alive(world, entity)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3da);
    _Var3 = ecs_sparse_is_alive((world->store).entity_index,entity);
    if (!_Var3) {
      __assert_fail("ecs_is_alive(world, entity)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3da,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    _ecs_assert(true,0xc,(char *)0x0,"src_table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3db);
    _ecs_assert(peVar8 != (ecs_data_t *)0x0,0xc,(char *)0x0,"src_data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3dc);
    if (peVar8 == (ecs_data_t *)0x0) {
      __assert_fail("src_data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3dc,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    _ecs_assert(-1 < iVar5,0xc,(char *)0x0,"src_row >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3dd);
    if (iVar5 < 0) {
      __assert_fail("src_row >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3dd,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    iVar4 = ecs_vector_count(peVar8->entities);
    _ecs_assert(iVar5 < iVar4,0xc,(char *)0x0,"ecs_vector_count(src_data->entities) > src_row",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3df);
    iVar4 = ecs_vector_count(peVar8->entities);
    if (iVar4 <= iVar5) {
      __assert_fail("ecs_vector_count(src_data->entities) > src_row",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3df,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    record = info->record;
    if (record == (ecs_record_t *)0x0) {
      _ecs_assert(true,0xc,(char *)0x0,"!record || record == ecs_eis_get(world, entity)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3e3);
    }
    else {
      peVar6 = (ecs_record_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
      _ecs_assert(record == peVar6,0xc,(char *)0x0,"!record || record == ecs_eis_get(world, entity)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3e3);
      peVar6 = (ecs_record_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
      if (record != peVar6) {
        __assert_fail("!record || record == ((ecs_record_t*)_ecs_sparse_get_sparse((world->store).entity_index, sizeof(ecs_record_t), entity))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x3e3,
                      "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
    }
    new_index = ecs_table_append(world,dst_table,data,entity,record,false);
    record->table = dst_table;
    uVar7 = ~new_index;
    if (info->is_watched == false) {
      uVar7 = new_index + 1;
    }
    record->row = uVar7;
    iVar4 = ecs_vector_count(peVar8->entities);
    _ecs_assert(iVar5 < iVar4,0xc,(char *)0x0,"ecs_vector_count(src_data->entities) > src_row",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3ec);
    iVar4 = ecs_vector_count(peVar8->entities);
    if (iVar4 <= iVar5) {
      __assert_fail("ecs_vector_count(src_data->entities) > src_row",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3ec,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    if (((table->type != (ecs_type_t)0x0) &&
        (ecs_table_move(world,entity,entity,dst_table,data,new_index,table,peVar8,iVar5),
        removed != (ecs_entities_t *)0x0)) && ((table->flags & 0xd104) != 0)) {
      ecs_run_monitors(world,dst_table,table->un_set_all,iVar5,1,dst_table->un_set_all);
      ecs_run_remove_actions(world,table,peVar8,iVar5,1,removed,false);
    }
    ecs_table_delete(world,table,peVar8,iVar5,false);
    if ((added != (ecs_entities_t *)0x0) && ((dst_table->flags & 0x1a884) != 0)) {
      ecs_run_add_actions(world,dst_table,data,new_index,1,added,false,true);
    }
    if ((dst_table->flags & 0x8000) != 0) {
      ecs_run_monitors(world,dst_table,dst_table->monitors,new_index,1,table->monitors);
    }
    if ((removed != (ecs_entities_t *)0x0) && ((dst_table->flags & 4) != 0)) {
      ecs_run_monitors(world,dst_table,table->on_set_override,new_index,1,dst_table->on_set_override
                      );
    }
    info->data = data;
    info->row = new_index;
  }
  info->table = dst_table;
LAB_00113871:
  if (info->is_watched == true) {
    update_component_monitors(world,entity,added,removed);
  }
  if (((table == (ecs_table_t *)0x0) || (table->type == (ecs_type_t)0x0)) &&
     (world->range_check_enabled == true)) {
    uVar2 = (world->stats).max_id;
    _ecs_assert(entity <= uVar2 || uVar2 == 0,0x1c,(char *)0x0,
                "!world->stats.max_id || entity <= world->stats.max_id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x4b3);
    uVar2 = (world->stats).max_id;
    if (uVar2 < entity && uVar2 != 0) {
      __assert_fail("!world->stats.max_id || entity <= world->stats.max_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x4b3,
                    "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    _ecs_assert((world->stats).min_id <= entity,0x1c,(char *)0x0,"entity >= world->stats.min_id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x4b4);
    if (entity < (world->stats).min_id) {
      __assert_fail("entity >= world->stats.min_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x4b4,
                    "void commit(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
  }
  return;
}

Assistant:

static
void commit(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info,
    ecs_table_t * dst_table,   
    ecs_entities_t * added,
    ecs_entities_t * removed)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);
    
    ecs_table_t *src_table = info->table;
    if (src_table == dst_table) {
        /* If source and destination table are the same no action is needed *
         * However, if a component was added in the process of traversing a
         * table, this suggests that a case switch could have occured. */
        if (((added && added->count) || (removed && removed->count)) && 
             src_table && src_table->flags & EcsTableHasSwitch) 
        {
            ecs_components_switch(
                world, src_table, info->data, info->row, 1, added, removed);
        }

        return;
    }  

    if (src_table) {
        ecs_data_t *src_data = info->data;
        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);

        if (dst_table->type) { 
            info->row = move_entity(world, entity, info, src_table, 
                src_data, info->row, dst_table, added, removed);
            info->table = dst_table;
        } else {
            delete_entity(
                world, src_table, src_data, info->row, 
                removed);

            ecs_eis_set(world, entity, &(ecs_record_t){
                NULL, (info->is_watched == true) * -1
            });
        }      
    } else {        
        if (dst_table->type) {
            info->row = new_entity(world, entity, info, dst_table, added);
            info->table = dst_table;
        }        
    }

    /* If the entity is being watched, it is being monitored for changes and
    * requires rematching systems when components are added or removed. This
    * ensures that systems that rely on components from containers or prefabs
    * update the matched tables when the application adds or removes a 
    * component from, for example, a container. */
    if (info->is_watched) {
        update_component_monitors(world, entity, added, removed);
    }

    if ((!src_table || !src_table->type) && world->range_check_enabled) {
        ecs_assert(!world->stats.max_id || entity <= world->stats.max_id, ECS_OUT_OF_RANGE, 0);
        ecs_assert(entity >= world->stats.min_id, ECS_OUT_OF_RANGE, 0);
    } 
}